

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

string ** google::protobuf::internal::MakeDenseEnumCache_abi_cxx11_
                    (EnumDescriptor *desc,int min_val,int max_val)

{
  int iVar1;
  EnumValueDescriptor *pEVar2;
  string **__s;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  iVar6 = max_val - min_val;
  uVar3 = 0xffffffffffffffff;
  if (-2 < iVar6) {
    uVar3 = (ulong)(iVar6 + 1) * 8;
  }
  __s = (string **)operator_new__(uVar3);
  memset(__s,0,uVar3);
  iVar1 = desc->value_count_;
  if (0 < (long)iVar1) {
    pEVar2 = desc->values_;
    lVar4 = 0;
    do {
      lVar5 = (long)*(int *)((long)&pEVar2->number_ + lVar4) - (long)min_val;
      if (__s[lVar5] == (string *)0x0) {
        __s[lVar5] = *(string **)((long)&pEVar2->all_names_ + lVar4);
      }
      lVar4 = lVar4 + 0x30;
    } while ((long)iVar1 * 0x30 != lVar4);
  }
  if (-1 < iVar6) {
    uVar3 = 0;
    do {
      if (__s[uVar3] == (string *)0x0) {
        __s[uVar3] = (string *)&fixed_address_empty_string;
      }
      uVar3 = uVar3 + 1;
    } while (iVar6 + 1 != uVar3);
  }
  return __s;
}

Assistant:

const std::string** MakeDenseEnumCache(const EnumDescriptor* desc, int min_val,
                                       int max_val) {
  auto* str_ptrs =
      new const std::string*[static_cast<size_t>(max_val - min_val + 1)]();
  const int count = desc->value_count();
  for (int i = 0; i < count; ++i) {
    const int num = desc->value(i)->number();
    if (str_ptrs[num - min_val] == nullptr) {
      // Don't over-write an existing entry, because in case of duplication, the
      // first one wins.
      str_ptrs[num - min_val] = &internal::NameOfEnumAsString(desc->value(i));
    }
  }
  // Change any unfilled entries to point to the empty string.
  for (int i = 0; i < max_val - min_val + 1; ++i) {
    if (str_ptrs[i] == nullptr) str_ptrs[i] = &GetEmptyStringAlreadyInited();
  }
  return str_ptrs;
}